

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_distinct_aggregator.cpp
# Opt level: O0

void __thiscall
duckdb::WindowDistinctAggregatorLocalState::FlushStates(WindowDistinctAggregatorLocalState *this)

{
  long lVar1;
  FunctionData *ptr_p;
  long in_RDI;
  AggregateInputData aggr_input_data;
  AggregateObject *aggr;
  optional_ptr<duckdb::FunctionData,_true> in_stack_ffffffffffffffd0;
  optional_ptr<duckdb::FunctionData,_true> in_stack_ffffffffffffffd8;
  Vector *in_stack_ffffffffffffffe0;
  
  if (*(long *)(in_RDI + 0x528) != 0) {
    lVar1 = *(long *)(in_RDI + 0x200);
    ptr_p = AggregateObject::GetFunctionData((AggregateObject *)in_stack_ffffffffffffffd0.ptr);
    optional_ptr<duckdb::FunctionData,_true>::optional_ptr
              ((optional_ptr<duckdb::FunctionData,_true> *)&stack0xffffffffffffffd0,ptr_p);
    AggregateInputData::AggregateInputData
              ((AggregateInputData *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd0,
               (ArenaAllocator *)(in_RDI + 8),PRESERVE_INPUT);
    Vector::Verify(in_stack_ffffffffffffffe0,(idx_t)in_stack_ffffffffffffffd8.ptr);
    (**(code **)(lVar1 + 0x128))
              (in_RDI + 0x4c0,in_RDI + 0x458,&stack0xffffffffffffffd8,
               *(undefined8 *)(in_RDI + 0x528));
    *(undefined8 *)(in_RDI + 0x528) = 0;
  }
  return;
}

Assistant:

void WindowDistinctAggregatorLocalState::FlushStates() {
	if (!flush_count) {
		return;
	}

	const auto &aggr = gastate.aggr;
	AggregateInputData aggr_input_data(aggr.GetFunctionData(), allocator);
	statel.Verify(flush_count);
	aggr.function.combine(statel, statep, aggr_input_data, flush_count);

	flush_count = 0;
}